

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::LoadModifications(cmCTestGIT *this)

{
  bool bVar1;
  undefined8 uVar2;
  char *this_00;
  reference pCVar3;
  Change *c;
  iterator __end1;
  iterator __begin1;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *__range1;
  OutputLogger err;
  DiffParser out;
  char *git_diff_index [6];
  undefined1 local_b8 [8];
  OutputLogger ui_err;
  OutputLogger ui_out;
  char *git_update_index [4];
  char *git;
  cmCTestGIT *this_local;
  
  uVar2 = std::__cxx11::string::c_str();
  ui_out.super_LineParser._56_8_ = uVar2;
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&ui_err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_b8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,(char **)&ui_out.super_LineParser.Separator,
                      (OutputParser *)&ui_err.super_LineParser.Separator,(OutputParser *)local_b8,
                      (char *)0x0,UTF8);
  out.CurChange.Path.field_2._8_8_ = uVar2;
  DiffParser::DiffParser((DiffParser *)&err.super_LineParser.Separator,this,"di-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&__range1,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"di-err> ")
  ;
  cmCTestVC::RunChild((cmCTestVC *)this,(char **)((long)&out.CurChange.Path.field_2 + 8),
                      (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)&__range1,
                      (char *)0x0,UTF8);
  this_00 = &out.super_LineParser.Separator;
  __end1 = std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::begin
                     ((vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *)
                      this_00);
  c = (Change *)
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::end
                ((vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *)
                 this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                                *)&c);
    if (!bVar1) break;
    pCVar3 = __gnu_cxx::
             __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
             ::operator*(&__end1);
    (*(this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this,1,&pCVar3->Path);
    __gnu_cxx::
    __normal_iterator<cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
    ::operator++(&__end1);
  }
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&__range1);
  DiffParser::~DiffParser((DiffParser *)&err.super_LineParser.Separator);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_b8);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&ui_err.super_LineParser.Separator);
  return true;
}

Assistant:

bool cmCTestGIT::LoadModifications()
{
  const char* git = this->CommandLineTool.c_str();

  // Use 'git update-index' to refresh the index w.r.t. the work tree.
  const char* git_update_index[] = { git, "update-index", "--refresh",
                                     nullptr };
  OutputLogger ui_out(this->Log, "ui-out> ");
  OutputLogger ui_err(this->Log, "ui-err> ");
  this->RunChild(git_update_index, &ui_out, &ui_err, nullptr,
                 cmProcessOutput::UTF8);

  // Use 'git diff-index' to get modified files.
  const char* git_diff_index[] = { git,    "diff-index", "-z",
                                   "HEAD", "--",         nullptr };
  DiffParser out(this, "di-out> ");
  OutputLogger err(this->Log, "di-err> ");
  this->RunChild(git_diff_index, &out, &err, nullptr, cmProcessOutput::UTF8);

  for (Change const& c : out.Changes) {
    this->DoModification(PathModified, c.Path);
  }
  return true;
}